

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O3

bool __thiscall
IR::Instr::IterateArgInstrs<BackwardPass::ProcessInlineeStart(IR::Instr*)::__0>
          (Instr *this,anon_class_8_1_da3b4f2a callback)

{
  Opnd *this_00;
  _func_int **pp_Var1;
  code *pcVar2;
  OpndKind OVar3;
  bool bVar4;
  OpCode OVar5;
  uint uVar6;
  StackSym *pSVar7;
  undefined4 *puVar8;
  uint uVar9;
  Instr *pIVar10;
  Instr *argInstr;
  anon_class_8_1_da3b4f2a local_38;
  anon_class_8_1_da3b4f2a callback_local;
  
  local_38.startCallInstr = callback.startCallInstr;
  pSVar7 = Opnd::GetStackSym(this->m_src2);
  argInstr = (pSVar7->field_5).m_instrDef;
  if ((argInstr != (Instr *)0x0 & pSVar7->field_0x18) == 1) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) {
LAB_003e9cbd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
    argInstr = (pSVar7->field_5).m_instrDef;
  }
  do {
    if ((argInstr->m_src2 == (Opnd *)0x0) ||
       (OVar3 = Opnd::GetKind(argInstr->m_src2), OVar3 != OpndKindSym)) {
LAB_003e9c41:
      pIVar10 = (Instr *)0x0;
    }
    else {
      this_00 = argInstr->m_src2;
      OVar3 = Opnd::GetKind(this_00);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_003e9cbd;
        *puVar8 = 0;
      }
      pp_Var1 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var1 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_003e9cbd;
        *puVar8 = 0;
      }
      uVar6 = *(uint *)(pp_Var1 + 3);
      uVar9 = uVar6 & 0x100000;
      if ((uVar9 != 0) && (*(short *)((long)pp_Var1 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_003e9cbd;
        *puVar8 = 0;
        uVar6 = *(uint *)(pp_Var1 + 3);
        uVar9 = uVar6 & 0x100000;
      }
      if (uVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar4) goto LAB_003e9cbd;
        *puVar8 = 0;
        uVar6 = *(uint *)(pp_Var1 + 3);
      }
      if (((((uVar6 & 1) == 0) || (pp_Var1[5] == (_func_int *)0x0)) &&
          (bVar4 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar4)) &&
         (bVar4 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar4) goto LAB_003e9cbd;
        *puVar8 = 0;
      }
      if (((ulong)pp_Var1[3] & 1) == 0) goto LAB_003e9c41;
      pIVar10 = (Instr *)pp_Var1[5];
    }
    OVar5 = argInstr->m_opcode;
    if (OVar5 != ArgOut_A_InlineSpecialized) {
      if (OVar5 == StartCall) {
        if (pIVar10 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          OVar5 = (OpCode)bVar4;
          if (!bVar4) goto LAB_003e9cbd;
          *puVar8 = 0;
        }
        break;
      }
      bVar4 = BackwardPass::ProcessInlineeStart::anon_class_8_1_da3b4f2a::operator()
                        (&local_38,argInstr);
      OVar5 = (OpCode)bVar4;
    }
    argInstr = pIVar10;
  } while (pIVar10 != (Instr *)0x0);
  return SUB21(OVar5,0);
}

Assistant:

bool IterateArgInstrs(Fn callback)
    {
        StackSym* linkSym = this->GetSrc2()->GetStackSym();
        Assert(linkSym->IsSingleDef());
        IR::Instr *argInstr = linkSym->m_instrDef;
        IR::Instr* nextArg = nullptr;
        do
        {
            // Get the next instr before calling 'callback' since callback might modify the IR.
            if (argInstr->GetSrc2() && argInstr->GetSrc2()->IsSymOpnd())
            {
                linkSym = argInstr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym();
                Assert(linkSym->IsArgSlotSym());

                // Due to dead code elimination in FGPeeps, it is possible for the definitions of the
                // the instructions that we are visiting during FG to have been freed. In this case,
                // the ArgSlot, even though its was a single def, will report IsSingleDef() as false
                // since instrDef is reset to nullptr when the def instr is freed
                Assert(linkSym->IsSingleDef() ||
                    (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)));
                nextArg = linkSym->GetInstrDef();
            }
            else
            {
                nextArg = nullptr;
            }
            if(argInstr->m_opcode == Js::OpCode::ArgOut_A_InlineSpecialized)
            {
                argInstr = nextArg;
                // This is a fake ArgOut, skip it
                continue;
            }
            if (argInstr->m_opcode == Js::OpCode::StartCall)
            {
                Assert(nextArg == nullptr);
                break;
            }

            if(callback(argInstr))
            {
                return true;
            }
            argInstr = nextArg;
        } while(argInstr && !argInstr->IsInvalidInstr());

        // If an instr in the call sequence is invalid (0xFDFDFDFD), it must have been freed.
        // This is possible if some dead-code-removal/peeps code removed only part of the call sequence, while the whole sequence was dead (TH Bug 594245).
        // We allow this possibility here, while relying on the more involved dead-code-removal to remove the rest of the call sequence.
        // Inserting the opcode InvalidOpCode, with no lowering, here to safeguard against the possibility of a dead part of the call sequence not being removed. The lowerer would assert then.
        if (argInstr && argInstr->IsInvalidInstr())
        {
            this->InsertBefore(Instr::New(Js::OpCode::InvalidOpCode, this->m_func));
        }
        return false;
    }